

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int32_t paramInteger(USystemParams *param,char *target,int32_t targetCapacity,UErrorCode *status)

{
  byte bVar1;
  int32_t iVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((byte *)param->paramStr == (byte *)0x0) {
LAB_001e0f87:
      iVar2 = integerToStringBuffer(target,targetCapacity,param->paramInt,10,status);
      return iVar2;
    }
    bVar1 = *param->paramStr;
    if (bVar1 < 0x6f) {
      if (bVar1 == 0x62) {
        iVar2 = integerToStringBuffer(target,targetCapacity,param->paramInt,2,status);
        return iVar2;
      }
      if (bVar1 == 100) goto LAB_001e0f87;
    }
    else {
      if (bVar1 == 0x6f) {
        iVar2 = integerToStringBuffer(target,targetCapacity,param->paramInt,8,status);
        return iVar2;
      }
      if (bVar1 == 0x78) {
        iVar2 = integerToStringBuffer(target,targetCapacity,param->paramInt,0x10,status);
        return iVar2;
      }
    }
    *status = U_INTERNAL_PROGRAM_ERROR;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }